

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BeginTrigger(Parse *pParse,Token *pName1,Token *pName2,int tr_tm,int op,IdList *pColumns
                        ,SrcList *pTableName,Expr *pWhen,int isTemp,int noErr)

{
  sqlite3 *db_00;
  u8 uVar1;
  int iVar2;
  Table *pTVar3;
  char *pcVar4;
  void *pvVar5;
  Trigger *pTVar6;
  Expr *pEVar7;
  IdList *pIVar8;
  int in_ECX;
  long in_RDX;
  Token *in_RSI;
  Parse *in_RDI;
  u8 in_R8B;
  char *zDbTrig;
  char *zDb;
  int code;
  int iTabDb;
  DbFixer sFix;
  Token *pName;
  int iDb;
  sqlite3 *db;
  char *zName;
  Table *pTab;
  Trigger *pTrigger;
  sqlite3 *in_stack_ffffffffffffff58;
  sqlite3 *in_stack_ffffffffffffff60;
  sqlite3 *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  sqlite3 *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  Parse *in_stack_ffffffffffffff88;
  Token *local_58;
  int local_4c;
  int local_1c;
  
  db_00 = in_RDI->db;
  if (code == 0) {
    local_4c = sqlite3TwoPartName((Parse *)in_stack_ffffffffffffff78,
                                  (Token *)CONCAT44(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70),
                                  (Token *)in_stack_ffffffffffffff68,
                                  (Token **)in_stack_ffffffffffffff60);
    if (local_4c < 0) goto LAB_00175509;
  }
  else {
    if (*(int *)(in_RDX + 8) != 0) {
      sqlite3ErrorMsg(in_RDI,"temporary trigger may not have qualified name");
      goto LAB_00175509;
    }
    local_4c = 1;
    local_58 = in_RSI;
  }
  if ((zDbTrig != (char *)0x0) && (db_00->mallocFailed == '\0')) {
    if (((db_00->init).busy != '\0') && (local_4c != 1)) {
      sqlite3DbFree(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      zDbTrig[0x10] = '\0';
      zDbTrig[0x11] = '\0';
      zDbTrig[0x12] = '\0';
      zDbTrig[0x13] = '\0';
      zDbTrig[0x14] = '\0';
      zDbTrig[0x15] = '\0';
      zDbTrig[0x16] = '\0';
      zDbTrig[0x17] = '\0';
    }
    pTVar3 = sqlite3SrcListLookup
                       ((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (SrcList *)in_stack_ffffffffffffff68);
    if (((((db_00->init).busy == '\0') && (*(int *)(in_RDX + 8) == 0)) && (pTVar3 != (Table *)0x0))
       && (pTVar3->pSchema == db_00->aDb[1].pSchema)) {
      local_4c = 1;
    }
    if (db_00->mallocFailed == '\0') {
      sqlite3FixInit((DbFixer *)&stack0xffffffffffffff78,in_RDI,local_4c,"trigger",local_58);
      iVar2 = sqlite3FixSrcList((DbFixer *)in_stack_ffffffffffffff78,
                                (SrcList *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if (iVar2 == 0) {
        pTVar3 = sqlite3SrcListLookup
                           ((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (SrcList *)in_stack_ffffffffffffff68);
        if (pTVar3 == (Table *)0x0) {
          if ((db_00->init).iDb == '\x01') {
            (db_00->init).orphanTrigger = '\x01';
          }
        }
        else if ((pTVar3->tabFlags & 0x10) == 0) {
          pcVar4 = sqlite3NameFromToken
                             (in_stack_ffffffffffffff60,(Token *)in_stack_ffffffffffffff58);
          if ((pcVar4 != (char *)0x0) &&
             (iVar2 = sqlite3CheckObjectName((Parse *)in_stack_ffffffffffffff58,(char *)0x17519d),
             iVar2 == 0)) {
            pvVar5 = sqlite3HashFind((Hash *)CONCAT44(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70),
                                     (char *)in_stack_ffffffffffffff68);
            if (pvVar5 == (void *)0x0) {
              iVar2 = sqlite3_strnicmp(pTVar3->zName,"sqlite_",7);
              if (iVar2 == 0) {
                sqlite3ErrorMsg(in_RDI,"cannot create trigger on system table");
                in_RDI->nErr = in_RDI->nErr + 1;
              }
              else if ((pTVar3->pSelect == (Select *)0x0) || (in_ECX == 0x31)) {
                if ((pTVar3->pSelect == (Select *)0x0) && (in_ECX == 0x31)) {
                  sqlite3ErrorMsg(in_RDI,"cannot create INSTEAD OF trigger on table: %S",zDbTrig,0);
                }
                else {
                  in_stack_ffffffffffffff74 = sqlite3SchemaToIndex(db_00,pTVar3->pSchema);
                  in_stack_ffffffffffffff70 = 7;
                  in_stack_ffffffffffffff68 = (sqlite3 *)db_00->aDb[in_stack_ffffffffffffff74].zName
                  ;
                  in_stack_ffffffffffffff58 = in_stack_ffffffffffffff68;
                  if (code != 0) {
                    in_stack_ffffffffffffff58 = (sqlite3 *)db_00->aDb[1].zName;
                  }
                  if ((in_stack_ffffffffffffff74 == 1) || (code != 0)) {
                    in_stack_ffffffffffffff70 = 5;
                  }
                  in_stack_ffffffffffffff60 = in_stack_ffffffffffffff58;
                  iVar2 = sqlite3AuthCheck(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                           (char *)in_stack_ffffffffffffff78,
                                           (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                            in_stack_ffffffffffffff70),
                                           (char *)in_stack_ffffffffffffff68);
                  if ((iVar2 == 0) &&
                     (iVar2 = sqlite3AuthCheck(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                               (char *)in_stack_ffffffffffffff78,
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               (char *)in_stack_ffffffffffffff68), iVar2 == 0)) {
                    local_1c = in_ECX;
                    if (in_ECX == 0x31) {
                      local_1c = 0x23;
                    }
                    pTVar6 = (Trigger *)
                             sqlite3DbMallocZero(in_stack_ffffffffffffff60,
                                                 (u64)in_stack_ffffffffffffff58);
                    if (pTVar6 != (Trigger *)0x0) {
                      pTVar6->zName = pcVar4;
                      pcVar4 = sqlite3DbStrDup(in_stack_ffffffffffffff68,
                                               (char *)in_stack_ffffffffffffff60);
                      pTVar6->table = pcVar4;
                      pTVar6->pSchema = db_00->aDb[local_4c].pSchema;
                      pTVar6->pTabSchema = pTVar3->pSchema;
                      pTVar6->op = in_R8B;
                      uVar1 = '\x02';
                      if (local_1c == 0x23) {
                        uVar1 = '\x01';
                      }
                      pTVar6->tr_tm = uVar1;
                      pEVar7 = sqlite3ExprDup(in_stack_ffffffffffffff60,
                                              (Expr *)in_stack_ffffffffffffff58,0);
                      pTVar6->pWhen = pEVar7;
                      pIVar8 = sqlite3IdListDup(in_stack_ffffffffffffff78,
                                                (IdList *)
                                                CONCAT44(in_stack_ffffffffffffff74,
                                                         in_stack_ffffffffffffff70));
                      pTVar6->pColumns = pIVar8;
                      in_RDI->pNewTrigger = pTVar6;
                    }
                  }
                }
              }
              else {
                pcVar4 = "AFTER";
                if (in_ECX == 0x23) {
                  pcVar4 = "BEFORE";
                }
                sqlite3ErrorMsg(in_RDI,"cannot create %s trigger on view: %S",pcVar4,zDbTrig,0);
              }
            }
            else if ((int)sFix.pParse == 0) {
              sqlite3ErrorMsg(in_RDI,"trigger %T already exists",local_58);
            }
            else {
              sqlite3CodeVerifySchema
                        ((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
            }
          }
        }
        else {
          sqlite3ErrorMsg(in_RDI,"cannot create triggers on virtual tables");
        }
      }
    }
  }
LAB_00175509:
  sqlite3DbFree(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  sqlite3SrcListDelete
            ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (SrcList *)in_stack_ffffffffffffff68);
  sqlite3IdListDelete(in_stack_ffffffffffffff60,(IdList *)in_stack_ffffffffffffff58);
  sqlite3ExprDelete(in_stack_ffffffffffffff60,(Expr *)in_stack_ffffffffffffff58);
  if (in_RDI->pNewTrigger == (Trigger *)0x0) {
    sqlite3DeleteTrigger(in_stack_ffffffffffffff60,(Trigger *)in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTrigger(
  Parse *pParse,      /* The parse context of the CREATE TRIGGER statement */
  Token *pName1,      /* The name of the trigger */
  Token *pName2,      /* The name of the trigger */
  int tr_tm,          /* One of TK_BEFORE, TK_AFTER, TK_INSTEAD */
  int op,             /* One of TK_INSERT, TK_UPDATE, TK_DELETE */
  IdList *pColumns,   /* column list if this is an UPDATE OF trigger */
  SrcList *pTableName,/* The name of the table/view the trigger applies to */
  Expr *pWhen,        /* WHEN clause */
  int isTemp,         /* True if the TEMPORARY keyword is present */
  int noErr           /* Suppress errors if the trigger already exists */
){
  Trigger *pTrigger = 0;  /* The new trigger */
  Table *pTab;            /* Table that the trigger fires off of */
  char *zName = 0;        /* Name of the trigger */
  sqlite3 *db = pParse->db;  /* The database connection */
  int iDb;                /* The database to store the trigger in */
  Token *pName;           /* The unqualified db name */
  DbFixer sFix;           /* State vector for the DB fixer */
  int iTabDb;             /* Index of the database holding pTab */

  assert( pName1!=0 );   /* pName1->z might be NULL, but not pName1 itself */
  assert( pName2!=0 );
  assert( op==TK_INSERT || op==TK_UPDATE || op==TK_DELETE );
  assert( op>0 && op<0xff );
  if( isTemp ){
    /* If TEMP was specified, then the trigger name may not be qualified. */
    if( pName2->n>0 ){
      sqlite3ErrorMsg(pParse, "temporary trigger may not have qualified name");
      goto trigger_cleanup;
    }
    iDb = 1;
    pName = pName1;
  }else{
    /* Figure out the db that the trigger will be created in */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ){
      goto trigger_cleanup;
    }
  }
  if( !pTableName || db->mallocFailed ){
    goto trigger_cleanup;
  }

  /* A long-standing parser bug is that this syntax was allowed:
  **
  **    CREATE TRIGGER attached.demo AFTER INSERT ON attached.tab ....
  **                                                 ^^^^^^^^
  **
  ** To maintain backwards compatibility, ignore the database
  ** name on pTableName if we are reparsing out of SQLITE_MASTER.
  */
  if( db->init.busy && iDb!=1 ){
    sqlite3DbFree(db, pTableName->a[0].zDatabase);
    pTableName->a[0].zDatabase = 0;
  }

  /* If the trigger name was unqualified, and the table is a temp table,
  ** then set iDb to 1 to create the trigger in the temporary database.
  ** If sqlite3SrcListLookup() returns 0, indicating the table does not
  ** exist, the error is caught by the block below.
  */
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( db->init.busy==0 && pName2->n==0 && pTab
        && pTab->pSchema==db->aDb[1].pSchema ){
    iDb = 1;
  }

  /* Ensure the table name matches database name and that the table exists */
  if( db->mallocFailed ) goto trigger_cleanup;
  assert( pTableName->nSrc==1 );
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", pName);
  if( sqlite3FixSrcList(&sFix, pTableName) ){
    goto trigger_cleanup;
  }
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( !pTab ){
    /* The table does not exist. */
    if( db->init.iDb==1 ){
      /* Ticket #3810.
      ** Normally, whenever a table is dropped, all associated triggers are
      ** dropped too.  But if a TEMP trigger is created on a non-TEMP table
      ** and the table is dropped by a different database connection, the
      ** trigger is not visible to the database connection that does the
      ** drop so the trigger cannot be dropped.  This results in an
      ** "orphaned trigger" - a trigger whose associated table is missing.
      */
      db->init.orphanTrigger = 1;
    }
    goto trigger_cleanup;
  }
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on virtual tables");
    goto trigger_cleanup;
  }

  /* Check that the trigger name is not reserved and that no trigger of the
  ** specified name exists */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName || SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
    goto trigger_cleanup;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  if( sqlite3HashFind(&(db->aDb[iDb].pSchema->trigHash),zName) ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "trigger %T already exists", pName);
    }else{
      assert( !db->init.busy );
      sqlite3CodeVerifySchema(pParse, iDb);
    }
    goto trigger_cleanup;
  }

  /* Do not create a trigger on a system table */
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 ){
    sqlite3ErrorMsg(pParse, "cannot create trigger on system table");
    pParse->nErr++;
    goto trigger_cleanup;
  }

  /* INSTEAD of triggers are only for views and views only support INSTEAD
  ** of triggers.
  */
  if( pTab->pSelect && tr_tm!=TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create %s trigger on view: %S", 
        (tr_tm == TK_BEFORE)?"BEFORE":"AFTER", pTableName, 0);
    goto trigger_cleanup;
  }
  if( !pTab->pSelect && tr_tm==TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create INSTEAD OF"
        " trigger on table: %S", pTableName, 0);
    goto trigger_cleanup;
  }
  iTabDb = sqlite3SchemaToIndex(db, pTab->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_CREATE_TRIGGER;
    const char *zDb = db->aDb[iTabDb].zName;
    const char *zDbTrig = isTemp ? db->aDb[1].zName : zDb;
    if( iTabDb==1 || isTemp ) code = SQLITE_CREATE_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, zName, pTab->zName, zDbTrig) ){
      goto trigger_cleanup;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iTabDb),0,zDb)){
      goto trigger_cleanup;
    }
  }
#endif

  /* INSTEAD OF triggers can only appear on views and BEFORE triggers
  ** cannot appear on views.  So we might as well translate every
  ** INSTEAD OF trigger into a BEFORE trigger.  It simplifies code
  ** elsewhere.
  */
  if (tr_tm == TK_INSTEAD){
    tr_tm = TK_BEFORE;
  }

  /* Build the Trigger object */
  pTrigger = (Trigger*)sqlite3DbMallocZero(db, sizeof(Trigger));
  if( pTrigger==0 ) goto trigger_cleanup;
  pTrigger->zName = zName;
  zName = 0;
  pTrigger->table = sqlite3DbStrDup(db, pTableName->a[0].zName);
  pTrigger->pSchema = db->aDb[iDb].pSchema;
  pTrigger->pTabSchema = pTab->pSchema;
  pTrigger->op = (u8)op;
  pTrigger->tr_tm = tr_tm==TK_BEFORE ? TRIGGER_BEFORE : TRIGGER_AFTER;
  pTrigger->pWhen = sqlite3ExprDup(db, pWhen, EXPRDUP_REDUCE);
  pTrigger->pColumns = sqlite3IdListDup(db, pColumns);
  assert( pParse->pNewTrigger==0 );
  pParse->pNewTrigger = pTrigger;

trigger_cleanup:
  sqlite3DbFree(db, zName);
  sqlite3SrcListDelete(db, pTableName);
  sqlite3IdListDelete(db, pColumns);
  sqlite3ExprDelete(db, pWhen);
  if( !pParse->pNewTrigger ){
    sqlite3DeleteTrigger(db, pTrigger);
  }else{
    assert( pParse->pNewTrigger==pTrigger );
  }
}